

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_compressionParameters ZVar3;
  U32 UVar4;
  size_t sVar5;
  uint uVar6;
  unsigned_long_long uVar7;
  
  ZVar3 = cPar;
  sVar5 = ZSTD_checkCParams(cPar);
  if (sVar5 != 0) {
    __assert_fail("ZSTD_checkCParams(cPar)==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2e4f,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t)"
                 );
  }
  uVar7 = 0x201;
  if (dictSize == 0) {
    uVar7 = srcSize;
  }
  if (srcSize != 0xffffffffffffffff) {
    uVar7 = srcSize;
  }
  if ((uVar7 | dictSize) < 0x40000000) {
    if (uVar7 + dictSize < 0x40) {
      uVar6 = 6;
    }
    else {
      UVar4 = ZSTD_highbit32((int)(uVar7 + dictSize) - 1);
      uVar6 = UVar4 + 1;
    }
    if (uVar6 < cPar.windowLog) {
      cPar.windowLog = uVar6;
    }
  }
  if (cPar.windowLog + 1 < cPar.hashLog) {
    cPar.hashLog = cPar.windowLog + 1;
  }
  uVar6 = (cPar.chainLog - 1) + (uint)(cPar.strategy < ZSTD_btlazy2);
  if (cPar.windowLog < uVar6) {
    cPar.chainLog = (cPar.chainLog + cPar.windowLog) - uVar6;
  }
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  uVar1 = ZVar3._12_8_;
  uVar2 = ZVar3._20_8_;
  __return_storage_ptr__->searchLog = (int)uVar1;
  __return_storage_ptr__->minMatch = (int)((ulong)uVar1 >> 0x20);
  __return_storage_ptr__->targetLength = (int)uVar2;
  __return_storage_ptr__->strategy = (int)((ulong)uVar2 >> 0x20);
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize)
{
    static const U64 minSrcSize = 513; /* (1<<9) + 1 */
    static const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
        srcSize = minSrcSize;

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (cPar.hashLog > cPar.windowLog+1) cPar.hashLog = cPar.windowLog+1;
    {   U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cycleLog > cPar.windowLog)
            cPar.chainLog -= (cycleLog - cPar.windowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    return cPar;
}